

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
kj::Vector<kj::(anonymous_namespace)::SocketAddress>::setCapacity
          (Vector<kj::(anonymous_namespace)::SocketAddress> *this,size_t newSize)

{
  RemoveConst<kj::(anonymous_namespace)::SocketAddress> *pRVar1;
  SocketAddress *pSVar2;
  ArrayDisposer *pAVar3;
  SocketAddress *__dest;
  ulong uVar4;
  SocketAddress *pSVar5;
  size_t __n;
  
  pSVar5 = (this->builder).ptr;
  uVar4 = ((long)(this->builder).pos - (long)pSVar5 >> 3) * -0xf0f0f0f0f0f0f0f;
  if (newSize <= uVar4 && uVar4 - newSize != 0) {
    (this->builder).pos = pSVar5 + newSize;
  }
  __dest = (SocketAddress *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x88,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pSVar5 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pSVar5;
  if (__n != 0) {
    memcpy(__dest,pSVar5,__n);
    pSVar5 = (this->builder).ptr;
  }
  if (pSVar5 != (SocketAddress *)0x0) {
    pRVar1 = (this->builder).pos;
    pSVar2 = (this->builder).endPtr;
    (this->builder).ptr = (SocketAddress *)0x0;
    (this->builder).pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
    (this->builder).endPtr = (SocketAddress *)0x0;
    pAVar3 = (this->builder).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pSVar5,0x88,((long)pRVar1 - (long)pSVar5 >> 3) * -0xf0f0f0f0f0f0f0f,
               ((long)pSVar2 - (long)pSVar5 >> 3) * -0xf0f0f0f0f0f0f0f,0);
  }
  (this->builder).ptr = __dest;
  (this->builder).pos =
       (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)((long)__dest + __n);
  (this->builder).endPtr = __dest + newSize;
  (this->builder).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }